

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O2

void __thiscall wasm::BinaryInstWriter::emitScopeEnd(BinaryInstWriter *this,Expression *curr)

{
  pointer pNVar1;
  
  pNVar1 = (this->breakStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((this->breakStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_start == pNVar1) {
    __assert_fail("!breakStack.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                  ,0xab0,"void wasm::BinaryInstWriter::emitScopeEnd(Expression *)");
  }
  (this->breakStack).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = pNVar1 + -1;
  BufferWithRandomAccess::operator<<(this->o,'\v');
  if ((this->func != (Function *)0x0) && (this->sourceMap == false)) {
    WasmBinaryWriter::writeDebugLocationEnd(this->parent,curr,this->func);
    return;
  }
  return;
}

Assistant:

void BinaryInstWriter::emitScopeEnd(Expression* curr) {
  assert(!breakStack.empty());
  breakStack.pop_back();
  o << int8_t(BinaryConsts::End);
  if (func && !sourceMap) {
    parent.writeDebugLocationEnd(curr, func);
  }
}